

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

void __thiscall
DCanvas::DrawLine(DCanvas *this,int x0,int y0,int x1,int y1,int palColor,uint32 realcolor)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  BYTE *pBVar5;
  int weighting_2;
  fixed_t errorAdj_1;
  int weighting_1;
  int weighting;
  fixed_t errorAdj;
  fixed_t errorAcc;
  int advance;
  BYTE *spot_1;
  BYTE *pBStack_50;
  int pitch;
  BYTE *spot;
  int temp;
  int xDir;
  int deltaY;
  int deltaX;
  int WEIGHTMASK;
  int NUMWEIGHTS;
  int WEIGHTSHIFT;
  int WEIGHTBITS;
  int WeightingScale;
  int palColor_local;
  int y1_local;
  int x1_local;
  int y0_local;
  int x0_local;
  DCanvas *this_local;
  
  WEIGHTBITS = palColor;
  palColor_local = x1;
  y1_local = y0;
  x1_local = x0;
  _y0_local = this;
  if (palColor < 0) {
    WEIGHTBITS = PalFromRGB(realcolor);
  }
  (*(this->super_DObject)._vptr_DObject[8])(this,1);
  iVar2 = x1_local;
  WeightingScale = y1;
  if (y1 < y1_local) {
    WeightingScale = y1_local;
    x1_local = palColor_local;
    palColor_local = iVar2;
    y1_local = y1;
  }
  PUTTRANSDOT(this,x1_local,y1_local,WEIGHTBITS,0);
  xDir = palColor_local - x1_local;
  if (xDir < 0) {
    spot._4_4_ = -1;
    xDir = -xDir;
  }
  else {
    spot._4_4_ = 1;
  }
  temp = WeightingScale - y1_local;
  if (temp == 0) {
    if (palColor_local < x1_local) {
      swapvalues<int>(&x1_local,&palColor_local);
    }
    pBVar5 = GetBuffer(this);
    iVar2 = y1_local;
    iVar1 = GetPitch(this);
    memset(pBVar5 + (long)x1_local + (long)(iVar2 * iVar1),WEIGHTBITS & 0xff,(long)(xDir + 1));
  }
  else if (xDir == 0) {
    pBStack_50 = GetBuffer(this);
    iVar2 = y1_local;
    iVar1 = GetPitch(this);
    pBStack_50 = pBStack_50 + (long)x1_local + (long)(iVar2 * iVar1);
    iVar2 = GetPitch(this);
    do {
      *pBStack_50 = (BYTE)WEIGHTBITS;
      pBStack_50 = pBStack_50 + iVar2;
      temp = temp + -1;
    } while (temp != 0);
  }
  else if (xDir == temp) {
    _errorAcc = GetBuffer(this);
    iVar2 = y1_local;
    iVar1 = GetPitch(this);
    _errorAcc = _errorAcc + (long)x1_local + (long)(iVar2 * iVar1);
    iVar2 = GetPitch(this);
    do {
      *_errorAcc = (BYTE)WEIGHTBITS;
      _errorAcc = _errorAcc + (iVar2 + spot._4_4_);
      temp = temp + -1;
    } while (temp != 0);
  }
  else {
    weighting = 0;
    if (xDir < temp) {
      uVar3 = (uint)(xDir << 0x10) / (uint)temp & 0xffff;
      if (spot._4_4_ < 0) {
        while (temp = temp + -1, temp != 0) {
          weighting = uVar3 + weighting;
          y1_local = y1_local + 1;
          uVar4 = weighting >> 10 & 0x3f;
          PUTTRANSDOT(this,x1_local - (weighting >> 0x10),y1_local,WEIGHTBITS,uVar4);
          PUTTRANSDOT(this,(x1_local - (weighting >> 0x10)) + -1,y1_local,WEIGHTBITS,0x3f - uVar4);
        }
      }
      else {
        while (temp = temp + -1, temp != 0) {
          weighting = uVar3 + weighting;
          y1_local = y1_local + 1;
          uVar4 = weighting >> 10 & 0x3f;
          PUTTRANSDOT(this,x1_local + (weighting >> 0x10),y1_local,WEIGHTBITS,uVar4);
          PUTTRANSDOT(this,x1_local + (weighting >> 0x10) + spot._4_4_,y1_local,WEIGHTBITS,
                      0x3f - uVar4);
        }
      }
    }
    else {
      uVar3 = (uint)(temp * 0x10000) / (uint)xDir;
      while (xDir = xDir + -1, xDir != 0) {
        weighting = (uVar3 & 0xffff) + weighting;
        x1_local = spot._4_4_ + x1_local;
        uVar4 = weighting >> 10 & 0x3f;
        PUTTRANSDOT(this,x1_local,y1_local + (weighting >> 0x10),WEIGHTBITS,uVar4);
        PUTTRANSDOT(this,x1_local,y1_local + (weighting >> 0x10) + 1,WEIGHTBITS,0x3f - uVar4);
      }
    }
    PUTTRANSDOT(this,palColor_local,WeightingScale,WEIGHTBITS,0);
  }
  (*(this->super_DObject)._vptr_DObject[9])();
  return;
}

Assistant:

void DCanvas::DrawLine(int x0, int y0, int x1, int y1, int palColor, uint32 realcolor)
//void DrawTransWuLine (int x0, int y0, int x1, int y1, BYTE palColor)
{
	const int WeightingScale = 0;
	const int WEIGHTBITS = 6;
	const int WEIGHTSHIFT = 16-WEIGHTBITS;
	const int NUMWEIGHTS = (1<<WEIGHTBITS);
	const int WEIGHTMASK = (NUMWEIGHTS-1);

	if (palColor < 0)
	{
		palColor = PalFromRGB(realcolor);
	}

	Lock();
	int deltaX, deltaY, xDir;

	if (y0 > y1)
	{
		int temp = y0; y0 = y1; y1 = temp;
		temp = x0; x0 = x1; x1 = temp;
	}

	PUTTRANSDOT (x0, y0, palColor, 0);

	if ((deltaX = x1 - x0) >= 0)
	{
		xDir = 1;
	}
	else
	{
		xDir = -1;
		deltaX = -deltaX;
	}

	if ((deltaY = y1 - y0) == 0)
	{ // horizontal line
		if (x0 > x1)
		{
			swapvalues (x0, x1);
		}
		memset (GetBuffer() + y0*GetPitch() + x0, palColor, deltaX+1);
	}
	else if (deltaX == 0)
	{ // vertical line
		BYTE *spot = GetBuffer() + y0*GetPitch() + x0;
		int pitch = GetPitch ();
		do
		{
			*spot = palColor;
			spot += pitch;
		} while (--deltaY != 0);
	}
	else if (deltaX == deltaY)
	{ // diagonal line.
		BYTE *spot = GetBuffer() + y0*GetPitch() + x0;
		int advance = GetPitch() + xDir;
		do
		{
			*spot = palColor;
			spot += advance;
		} while (--deltaY != 0);
	}
	else
	{
		// line is not horizontal, diagonal, or vertical
		fixed_t errorAcc = 0;

		if (deltaY > deltaX)
		{ // y-major line
			fixed_t errorAdj = (((unsigned)deltaX << 16) / (unsigned)deltaY) & 0xffff;
			if (xDir < 0)
			{
				if (WeightingScale == 0)
				{
					while (--deltaY)
					{
						errorAcc += errorAdj;
						y0++;
						int weighting = (errorAcc >> WEIGHTSHIFT) & WEIGHTMASK;
						PUTTRANSDOT (x0 - (errorAcc >> 16), y0, palColor, weighting);
						PUTTRANSDOT (x0 - (errorAcc >> 16) - 1, y0,
								palColor, WEIGHTMASK - weighting);
					}
				}
				else
				{
					while (--deltaY)
					{
						errorAcc += errorAdj;
						y0++;
						int weighting = ((errorAcc * WeightingScale) >> (WEIGHTSHIFT+8)) & WEIGHTMASK;
						PUTTRANSDOT (x0 - (errorAcc >> 16), y0, palColor, weighting);
						PUTTRANSDOT (x0 - (errorAcc >> 16) - 1, y0,
								palColor, WEIGHTMASK - weighting);
					}
				}
			}
			else
			{
				if (WeightingScale == 0)
				{
					while (--deltaY)
					{
						errorAcc += errorAdj;
						y0++;
						int weighting = (errorAcc >> WEIGHTSHIFT) & WEIGHTMASK;
						PUTTRANSDOT (x0 + (errorAcc >> 16), y0, palColor, weighting);
						PUTTRANSDOT (x0 + (errorAcc >> 16) + xDir, y0,
								palColor, WEIGHTMASK - weighting);
					}
				}
				else
				{
					while (--deltaY)
					{
						errorAcc += errorAdj;
						y0++;
						int weighting = ((errorAcc * WeightingScale) >> (WEIGHTSHIFT+8)) & WEIGHTMASK;
						PUTTRANSDOT (x0 + (errorAcc >> 16), y0, palColor, weighting);
						PUTTRANSDOT (x0 + (errorAcc >> 16) + xDir, y0,
								palColor, WEIGHTMASK - weighting);
					}
				}
			}
		}
		else
		{ // x-major line
			fixed_t errorAdj = (((DWORD) deltaY << 16) / (DWORD) deltaX) & 0xffff;

			if (WeightingScale == 0)
			{
				while (--deltaX)
				{
					errorAcc += errorAdj;
					x0 += xDir;
					int weighting = (errorAcc >> WEIGHTSHIFT) & WEIGHTMASK;
					PUTTRANSDOT (x0, y0 + (errorAcc >> 16), palColor, weighting);
					PUTTRANSDOT (x0, y0 + (errorAcc >> 16) + 1,
							palColor, WEIGHTMASK - weighting);
				}
			}
			else
			{
				while (--deltaX)
				{
					errorAcc += errorAdj;
					x0 += xDir;
					int weighting = ((errorAcc * WeightingScale) >> (WEIGHTSHIFT+8)) & WEIGHTMASK;
					PUTTRANSDOT (x0, y0 + (errorAcc >> 16), palColor, weighting);
					PUTTRANSDOT (x0, y0 + (errorAcc >> 16) + 1,
							palColor, WEIGHTMASK - weighting);
				}
			}
		}
		PUTTRANSDOT (x1, y1, palColor, 0);
	}
	Unlock();
}